

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int Train(string *alphabetFile,string *datasetFile,string *resultModelFile)

{
  undefined1 local_118 [8];
  TLangModel model;
  string *resultModelFile_local;
  string *datasetFile_local;
  string *alphabetFile_local;
  
  model.CheckSum = (uint64_t)resultModelFile;
  NJamSpell::TLangModel::TLangModel((TLangModel *)local_118);
  NJamSpell::TLangModel::Train((TLangModel *)local_118,datasetFile,alphabetFile);
  NJamSpell::TLangModel::Dump((TLangModel *)local_118,(string *)model.CheckSum);
  NJamSpell::TLangModel::~TLangModel((TLangModel *)local_118);
  return 0;
}

Assistant:

int Train(const std::string& alphabetFile,
          const std::string& datasetFile,
          const std::string& resultModelFile)
{
    TLangModel model;
    model.Train(datasetFile, alphabetFile);
    model.Dump(resultModelFile);
    return 0;
}